

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Edge * __thiscall Graph::findEdge(Graph *this,int originID,int destinyID)

{
  int iVar1;
  Vertex *pVVar2;
  Edge *local_30;
  Edge *a;
  Vertex *v;
  int destinyID_local;
  int originID_local;
  Graph *this_local;
  
  a = (Edge *)get_verticesList(this);
  do {
    if (a == (Edge *)0x0) {
      return (Edge *)0x0;
    }
    for (local_30 = Vertex::getEdgesList((Vertex *)a); local_30 != (Edge *)0x0;
        local_30 = Edge::getNext(local_30)) {
      pVVar2 = Edge::getOrigin(local_30);
      iVar1 = Vertex::getID(pVVar2);
      if (iVar1 == originID) {
        pVVar2 = Edge::getDestiny(local_30);
        iVar1 = Vertex::getID(pVVar2);
        if (iVar1 == destinyID) {
          return local_30;
        }
      }
    }
    a = (Edge *)Vertex::getNext((Vertex *)a);
  } while( true );
}

Assistant:

Edge *Graph::findEdge(int originID, int destinyID){
    for(Vertex *v= get_verticesList(); v != NULL; v= v->getNext()){
        for(Edge *a= v->getEdgesList(); a != NULL; a= a->getNext()){
            if(a->getOrigin()->getID() == originID && a->getDestiny()->getID() == destinyID)
                return a;
        }
    }
    return NULL;
}